

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Benchmark(Benchmark *this)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  Cache *pCVar4;
  FilterPolicy *pFVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  leveldb local_c8 [8];
  Status local_c0;
  Status local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Options local_90;
  
  if ((long)FLAGS_cache_size < 0) {
    pCVar4 = (Cache *)0x0;
  }
  else {
    pCVar4 = NewLRUCache((long)FLAGS_cache_size);
  }
  this->cache_ = pCVar4;
  if (FLAGS_bloom_bits < 0) {
    pFVar5 = (FilterPolicy *)0x0;
  }
  else {
    pFVar5 = NewBloomFilterPolicy(FLAGS_bloom_bits);
  }
  this->filter_policy_ = pFVar5;
  this->db_ = (DB *)0x0;
  iVar1 = FLAGS_num;
  this->num_ = FLAGS_num;
  this->value_size_ = FLAGS_value_size;
  this->entries_per_batch_ = 1;
  (this->write_options_).sync = false;
  iVar6 = FLAGS_reads;
  if (FLAGS_reads < 0) {
    iVar6 = iVar1;
  }
  this->reads_ = iVar6;
  this->heap_counter_ = 0;
  plVar2 = (anonymous_namespace)::g_env;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_90,FLAGS_db,(allocator *)&local_108);
  (**(code **)(*plVar2 + 0x38))(&local_b8,plVar2,&local_90,&local_e8);
  Status::~Status(&local_b8);
  std::__cxx11::string::_M_dispose();
  lVar8 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    local_90.comparator =
         *(Comparator **)
          ((long)&((local_e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8);
    local_90._8_8_ =
         *(undefined8 *)
          ((long)&(local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar8);
    local_108._M_dataplus._M_p = "heap-";
    local_108._M_string_length = 5;
    bVar3 = Slice::starts_with((Slice *)&local_90,(Slice *)&local_108);
    plVar2 = (anonymous_namespace)::g_env;
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_b0,FLAGS_db,&local_109);
      std::operator+(&local_108,&local_b0,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     &local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_e8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8
                     ));
      (**(code **)(*plVar2 + 0x40))(&local_c0,plVar2,&local_90);
      Status::~Status(&local_c0);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    lVar8 = lVar8 + 0x20;
  }
  if (FLAGS_use_existing_db == false) {
    std::__cxx11::string::string((string *)&local_108,FLAGS_db,(allocator *)&local_b0);
    Options::Options(&local_90);
    DestroyDB(local_c8,&local_108,&local_90);
    Status::~Status((Status *)local_c8);
    std::__cxx11::string::_M_dispose();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

Benchmark()
      : cache_(FLAGS_cache_size >= 0 ? NewLRUCache(FLAGS_cache_size) : nullptr),
        filter_policy_(FLAGS_bloom_bits >= 0
                           ? NewBloomFilterPolicy(FLAGS_bloom_bits)
                           : nullptr),
        db_(nullptr),
        num_(FLAGS_num),
        value_size_(FLAGS_value_size),
        entries_per_batch_(1),
        reads_(FLAGS_reads < 0 ? FLAGS_num : FLAGS_reads),
        heap_counter_(0) {
    std::vector<std::string> files;
    g_env->GetChildren(FLAGS_db, &files);
    for (size_t i = 0; i < files.size(); i++) {
      if (Slice(files[i]).starts_with("heap-")) {
        g_env->RemoveFile(std::string(FLAGS_db) + "/" + files[i]);
      }
    }
    if (!FLAGS_use_existing_db) {
      DestroyDB(FLAGS_db, Options());
    }
  }